

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall XipFile::dirhexdump(XipFile *this)

{
  ReadWriter_ptr *pRVar1;
  uint uVar2;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint i_1;
  long lVar4;
  uint i;
  ulong uVar5;
  string local_88;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *local_68;
  ByteVector fileentries;
  ByteVector modentries;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&modentries,(ulong)(this->_hdr).nummods << 5,(allocator_type *)&local_88);
  pRVar1 = &this->_r;
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)&local_88,
             &pRVar1->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)local_88._M_dataplus._M_p + 0x20))
            (local_88._M_dataplus._M_p,(this->_hdr).modlistpos);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  local_68 = &pRVar1->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)&local_88,
             &pRVar1->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)local_88._M_dataplus._M_p + 0x10))
            (local_88._M_dataplus._M_p,
             modentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)modentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)modentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  puts("offset     attr     ftlo     fthi     size     nameptr  e32      o32      baseaddr");
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < (this->_hdr).nummods; uVar5 = uVar5 + 1) {
    uVar2 = (this->_hdr).modlistpos;
    hexdump<unsigned_char*>
              (&local_88,
               modentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar4,8,4,ET_LITTLEENDIAN);
    printf("%08lx: %s\n",(ulong)uVar2 + lVar4,local_88._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_88);
    lVar4 = lVar4 + 0x20;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&fileentries,(ulong)(this->_hdr).numfiles * 0x1c,(allocator_type *)&local_88);
  p_Var3 = local_68;
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)&local_88,local_68);
  (**(code **)(*(long *)local_88._M_dataplus._M_p + 0x20))
            (local_88._M_dataplus._M_p,(this->_hdr).filelistpos);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)&local_88,p_Var3);
  (**(code **)(*(long *)local_88._M_dataplus._M_p + 0x10))
            (local_88._M_dataplus._M_p,
             fileentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)fileentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)fileentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  puts("offset     attr     ftlo     fthi     fullsize compsize nameptr  dataptr");
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < (this->_hdr).numfiles; uVar5 = uVar5 + 1) {
    uVar2 = (this->_hdr).filelistpos;
    hexdump<unsigned_char*>
              (&local_88,
               fileentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start + lVar4,7,4,ET_LITTLEENDIAN);
    printf("%08lx: %s\n",(ulong)uVar2 + lVar4,local_88._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_88);
    lVar4 = lVar4 + 0x1c;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&fileentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&modentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

virtual void dirhexdump()
    {
        // first dump modules
        ByteVector modentries(_hdr.nummods*TocEntry::size());
        rd()->setpos(_hdr.modlistpos);
        rd()->read(&modentries[0], modentries.size());
        printf("offset     attr     ftlo     fthi     size     nameptr  e32      o32      baseaddr\n");
        for (unsigned i=0  ; i<_hdr.nummods ; i++)
            printf("%08lx: %s\n", _hdr.modlistpos+i*TocEntry::size(), hexdump(&modentries[i*TocEntry::size()], TocEntry::size()/4, 4).c_str());

        ByteVector fileentries(_hdr.numfiles*FileEntry::size());
        rd()->setpos(_hdr.filelistpos);
        rd()->read(&fileentries[0], fileentries.size());
        printf("offset     attr     ftlo     fthi     fullsize compsize nameptr  dataptr\n");
        for (unsigned i=0  ; i<_hdr.numfiles ; i++)
            printf("%08lx: %s\n", _hdr.filelistpos+i*FileEntry::size(), hexdump(&fileentries[i*FileEntry::size()], FileEntry::size()/4, 4).c_str());
    }